

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

_Bool fast_interp_search(AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  int iVar1;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  BLOCK_SIZE in_R8B;
  int in_stack_00000028;
  int in_stack_0000002c;
  MACROBLOCKD *in_stack_00000030;
  _Bool is_hbd;
  int height;
  int width;
  _Bool is_best_pred_in_orig;
  RD_STATS tmp_rd;
  int64_t cost;
  int i;
  BUFFER_SET *dst_bufs [2];
  BUFFER_SET tmp_dst;
  uint8_t *tmp_buf;
  BUFFER_SET orig_dst;
  macroblockd_plane *pd;
  int is_240p_or_lesser;
  int num_planes;
  int best_filter_index;
  int64_t best_cost;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MACROBLOCKD *in_stack_fffffffffffffe98;
  uint8_t *puVar2;
  MACROBLOCKD *xd_00;
  MACROBLOCK *x_00;
  undefined8 in_stack_fffffffffffffec0;
  BUFFER_SET **in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  BLOCK_SIZE in_stack_fffffffffffffed7;
  undefined4 in_stack_fffffffffffffed8;
  int iVar3;
  int in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  uint in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar4;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  long local_108;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  long local_e8;
  int16_t local_dc [2];
  uint8_t **local_d8;
  uint8_t **local_d0;
  uint8_t *local_c8;
  uint8_t *local_c0;
  uint8_t *local_b8;
  int local_b0;
  undefined4 local_ac;
  int local_a8;
  uint8_t *local_a0;
  uint8_t *local_98;
  uint8_t *local_90;
  uint8_t *local_88;
  int local_80;
  int local_7c;
  int local_78;
  macroblockd_plane *local_70;
  int16_t local_64 [2];
  int16_t local_60 [2];
  int16_t local_5c [2];
  long local_58;
  MB_MODE_INFO *local_50;
  MACROBLOCKD *local_48;
  AV1_COMMON *local_40;
  BLOCK_SIZE local_31;
  MACROBLOCK *local_28;
  AV1_COMP *local_20;
  _Bool local_11;
  
  local_40 = &in_RDI->common;
  local_48 = &in_RSI->e_mbd;
  local_50 = *(in_RSI->e_mbd).mi;
  local_58 = 0x7fffffffffffffff;
  local_5c[0] = -1;
  local_5c[1] = -1;
  local_31 = in_R8B;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_60 = (int16_t  [2])av1_num_planes(local_40);
  if (local_40->width < local_40->height) {
    iVar3 = local_40->width;
  }
  else {
    iVar3 = local_40->height;
  }
  local_64._1_3_ = 0;
  local_64[0]._0_1_ = iVar3 < 0xf1;
  iVar1 = av1_is_interp_needed(in_stack_fffffffffffffe98);
  if (iVar1 == 0) {
    local_11 = false;
  }
  else {
    local_70 = local_48->plane;
    local_98 = local_48->plane[0].dst.buf;
    local_90 = local_48->plane[1].dst.buf;
    local_88 = local_48->plane[2].dst.buf;
    local_80 = local_48->plane[0].dst.stride;
    local_7c = local_48->plane[1].dst.stride;
    local_78 = local_48->plane[2].dst.stride;
    local_c8 = get_buf_by_bd(local_48,local_28->tmp_pred_bufs[0]);
    local_c0 = local_c8 + 0x4000;
    local_b8 = local_c8 + 0x8000;
    local_b0 = 0x80;
    local_ac = 0x80;
    local_a8 = 0x80;
    local_d8 = &local_98;
    local_d0 = &local_c8;
    local_dc[0] = 0;
    local_dc[1] = 0;
    local_a0 = local_c8;
    for (; (int)local_dc < 3; local_dc = (int16_t  [2])((int)local_dc + 1)) {
      if (local_64 == (int16_t  [2])0x0) {
        if (fast_interp_search::filters_ref_set[(int)local_dc].x_filter != 2) goto LAB_002df71e;
      }
      else if (fast_interp_search::filters_ref_set[(int)local_dc].x_filter != 1) {
LAB_002df71e:
        memset(&stack0xfffffffffffffef0,0,0x28);
        local_50->interp_filters =
             *(int_interpfilters *)(fast_interp_search::filters_ref_set + (int)local_dc);
        av1_enc_build_inter_predictor_y(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
        puVar2 = &stack0xffffffffffffff10;
        xd_00 = (MACROBLOCKD *)&stack0xffffffffffffff08;
        x_00 = (MACROBLOCK *)0x0;
        in_stack_fffffffffffffec0 = 0;
        in_stack_fffffffffffffec8 = (BUFFER_SET **)0x0;
        (*model_rd_sb_fn[(int)(uint)((local_20->sf).rt_sf.use_simple_rd_model == 0)])
                  (local_20,local_31,local_28,local_48,0,0,(int *)&stack0xfffffffffffffef0,
                   &local_108,puVar2,(int64_t *)xd_00,(int *)0x0,(int64_t *)0x0,(int64_t *)0x0);
        iVar1 = av1_get_switchable_rate
                          (x_00,xd_00,(InterpFilter)((ulong)puVar2 >> 0x38),(int)puVar2);
        in_stack_fffffffffffffef0 = iVar1 + in_stack_fffffffffffffef0;
        local_e8 = ((long)in_stack_fffffffffffffef0 * (long)local_28->rdmult + 0x100 >> 9) +
                   local_108 * 0x80;
        if (local_e8 < local_58) {
          local_5c[0] = local_dc[0];
          local_5c[1] = local_dc[1];
          local_58 = local_e8;
          swap_dst_buf((MACROBLOCKD *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        }
      }
    }
    local_50->interp_filters =
         *(int_interpfilters *)(fast_interp_search::filters_ref_set + (int)local_5c);
    uVar4 = CONCAT13(&local_98 == local_d0,(int3)in_stack_fffffffffffffeec);
    if (&local_98 == local_d0) {
      swap_dst_buf((MACROBLOCKD *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    }
    else {
      in_stack_fffffffffffffee8 = (uint)block_size_wide[local_31];
      in_stack_fffffffffffffee4 = (uint)block_size_high[local_31];
      iVar1 = is_cur_buf_hbd(local_48);
      in_stack_fffffffffffffee0 = CONCAT13(iVar1 != 0,(int3)in_stack_fffffffffffffee0);
      if (iVar1 != 0) {
        (*aom_highbd_convolve_copy)
                  ((uint16_t *)((long)local_c8 << 1),(long)local_b0,
                   (uint16_t *)((long)local_98 << 1),(long)local_80,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee4);
      }
      else {
        (*aom_convolve_copy)
                  (local_c8,(long)local_b0,local_98,(long)local_80,in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee4);
      }
    }
    if (1 < (int)local_60) {
      av1_enc_build_inter_predictor
                ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (MACROBLOCKD *)CONCAT44(uVar4,in_stack_fffffffffffffee8),in_stack_fffffffffffffee4,
                 in_stack_fffffffffffffee0,(BUFFER_SET *)CONCAT44(iVar3,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed7,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    }
    local_11 = true;
  }
  return local_11;
}

Assistant:

static inline bool fast_interp_search(const AV1_COMP *cpi, MACROBLOCK *x,
                                      int mi_row, int mi_col,
                                      BLOCK_SIZE bsize) {
  static const InterpFilters filters_ref_set[3] = {
    { EIGHTTAP_REGULAR, EIGHTTAP_REGULAR },
    { EIGHTTAP_SMOOTH, EIGHTTAP_SMOOTH },
    { MULTITAP_SHARP, MULTITAP_SHARP }
  };

  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  int64_t best_cost = INT64_MAX;
  int best_filter_index = -1;
  // dst_bufs[0] sores the new predictor, and dist_bifs[1] stores the best
  const int num_planes = av1_num_planes(cm);
  const int is_240p_or_lesser = AOMMIN(cm->width, cm->height) <= 240;
  assert(is_inter_mode(mi->mode));
  assert(mi->motion_mode == SIMPLE_TRANSLATION);
  assert(!is_inter_compound_mode(mi->mode));

  if (!av1_is_interp_needed(xd)) {
    return false;
  }

  struct macroblockd_plane *pd = xd->plane;
  const BUFFER_SET orig_dst = {
    { pd[0].dst.buf, pd[1].dst.buf, pd[2].dst.buf },
    { pd[0].dst.stride, pd[1].dst.stride, pd[2].dst.stride },
  };
  uint8_t *const tmp_buf = get_buf_by_bd(xd, x->tmp_pred_bufs[0]);
  const BUFFER_SET tmp_dst = { { tmp_buf, tmp_buf + 1 * MAX_SB_SQUARE,
                                 tmp_buf + 2 * MAX_SB_SQUARE },
                               { MAX_SB_SIZE, MAX_SB_SIZE, MAX_SB_SIZE } };
  const BUFFER_SET *dst_bufs[2] = { &orig_dst, &tmp_dst };

  for (int i = 0; i < 3; ++i) {
    if (is_240p_or_lesser) {
      if (filters_ref_set[i].x_filter == EIGHTTAP_SMOOTH) {
        continue;
      }
    } else {
      if (filters_ref_set[i].x_filter == MULTITAP_SHARP) {
        continue;
      }
    }
    int64_t cost;
    RD_STATS tmp_rd = { 0 };

    mi->interp_filters.as_filters = filters_ref_set[i];
    av1_enc_build_inter_predictor_y(xd, mi_row, mi_col);

    model_rd_sb_fn[cpi->sf.rt_sf.use_simple_rd_model
                       ? MODELRD_LEGACY
                       : MODELRD_TYPE_INTERP_FILTER](
        cpi, bsize, x, xd, AOM_PLANE_Y, AOM_PLANE_Y, &tmp_rd.rate, &tmp_rd.dist,
        &tmp_rd.skip_txfm, &tmp_rd.sse, NULL, NULL, NULL);

    tmp_rd.rate += av1_get_switchable_rate(x, xd, cm->features.interp_filter,
                                           cm->seq_params->enable_dual_filter);
    cost = RDCOST(x->rdmult, tmp_rd.rate, tmp_rd.dist);
    if (cost < best_cost) {
      best_filter_index = i;
      best_cost = cost;
      swap_dst_buf(xd, dst_bufs, num_planes);
    }
  }
  assert(best_filter_index >= 0);

  mi->interp_filters.as_filters = filters_ref_set[best_filter_index];

  const bool is_best_pred_in_orig = &orig_dst == dst_bufs[1];

  if (is_best_pred_in_orig) {
    swap_dst_buf(xd, dst_bufs, num_planes);
  } else {
    // Note that xd->pd's bufers are kept in sync with dst_bufs[0]. So if
    // is_best_pred_in_orig is false, that means the current buffer is the
    // original one.
    assert(&orig_dst == dst_bufs[0]);
    assert(xd->plane[AOM_PLANE_Y].dst.buf == orig_dst.plane[AOM_PLANE_Y]);
    const int width = block_size_wide[bsize];
    const int height = block_size_high[bsize];
#if CONFIG_AV1_HIGHBITDEPTH
    const bool is_hbd = is_cur_buf_hbd(xd);
    if (is_hbd) {
      aom_highbd_convolve_copy(CONVERT_TO_SHORTPTR(tmp_dst.plane[AOM_PLANE_Y]),
                               tmp_dst.stride[AOM_PLANE_Y],
                               CONVERT_TO_SHORTPTR(orig_dst.plane[AOM_PLANE_Y]),
                               orig_dst.stride[AOM_PLANE_Y], width, height);
    } else {
      aom_convolve_copy(tmp_dst.plane[AOM_PLANE_Y], tmp_dst.stride[AOM_PLANE_Y],
                        orig_dst.plane[AOM_PLANE_Y],
                        orig_dst.stride[AOM_PLANE_Y], width, height);
    }
#else
    aom_convolve_copy(tmp_dst.plane[AOM_PLANE_Y], tmp_dst.stride[AOM_PLANE_Y],
                      orig_dst.plane[AOM_PLANE_Y], orig_dst.stride[AOM_PLANE_Y],
                      width, height);
#endif
  }

  // Build the YUV predictor.
  if (num_planes > 1) {
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  AOM_PLANE_U, AOM_PLANE_V);
  }

  return true;
}